

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestWithCustomGenerator.cpp
# Opt level: O0

void __thiscall PropTestCustomGen::PropTestCustomGen(PropTestCustomGen *this)

{
  undefined8 *in_RDI;
  Generator<Rectangle> *in_stack_ffffffffffffffd8;
  Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_ffffffffffffffe0;
  CustomGenerator *in_stack_ffffffffffffffe8;
  Generator<Rectangle> *in_stack_fffffffffffffff0;
  
  cppqc::Generator<Rectangle>::Generator<CustomGenerator>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  cppqc::
  Property<Rectangle,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ::Property(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  cppqc::Generator<Rectangle>::~Generator((Generator<Rectangle> *)0x115410);
  *in_RDI = &PTR_expect_00122b70;
  return;
}

Assistant:

PropTestCustomGen() : Property(CustomGenerator()) {}